

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O0

void __thiscall
CNscPStackEntry::PushStatement(CNscPStackEntry *this,int nLocals,uchar *pauchData,size_t nDataSize)

{
  long *plVar1;
  size_t in_RCX;
  void *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  NscPCodeStatement *p;
  uchar *pauchPCode;
  size_t nSize;
  size_t in_stack_ffffffffffffffc8;
  CNscPStackEntry *in_stack_ffffffffffffffd0;
  
  MakeRoom(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  plVar1 = (long *)(*(long *)(in_RDI + 0x70) + *(long *)(in_RDI + 0x78));
  *plVar1 = in_RCX + 0x28;
  *(undefined4 *)(plVar1 + 1) = 3;
  *(undefined4 *)((long)plVar1 + 0xc) = 0;
  *(undefined4 *)(plVar1 + 2) = in_ESI;
  plVar1[4] = 0x28;
  plVar1[3] = in_RCX;
  memcpy((void *)((long)plVar1 + plVar1[4]),in_RDX,in_RCX);
  *(size_t *)(in_RDI + 0x78) = in_RCX + 0x28 + *(long *)(in_RDI + 0x78);
  return;
}

Assistant:

void CNscPStackEntry::PushStatement (int nLocals,
	const unsigned char *pauchData, size_t nDataSize)
{

	//
	// Make room for the pcode block
	//

	size_t nSize = sizeof (NscPCodeStatement) + nDataSize;
	MakeRoom (nSize);

	//
	// Initialize the block
	//

	unsigned char *pauchPCode = &m_pauchData [m_nDataSize];
	NscPCodeStatement *p = (NscPCodeStatement *) pauchPCode;
	p ->nOpSize = nSize;
	p ->nOpCode = NscPCode_Statement;
	p ->nType = NscType_Unknown;
	p ->nLocals = nLocals;
	p ->nDataOffset = sizeof (NscPCodeStatement);
	p ->nDataSize = nDataSize;
	memcpy (&pauchPCode [p ->nDataOffset], pauchData, nDataSize);

	//
	// Adjust the size of the entry
	//

	m_nDataSize += nSize;
}